

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

string * __thiscall QPDF::getPDFVersion_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  long lVar2;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)&((_Var1._M_head_impl)->pdf_version)._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,
             *(size_type *)((long)&(_Var1._M_head_impl)->pdf_version + 8) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getPDFVersion() const
{
    return m->pdf_version;
}